

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O0

void __thiscall
QtMWidgets::AbstractScrollArea::AbstractScrollArea
          (AbstractScrollArea *this,AbstractScrollAreaPrivate *dd,QWidget *parent)

{
  AbstractScrollAreaPrivate *pAVar1;
  QWidget *ctx;
  ConnectionType type;
  Object local_180 [8];
  code *local_178;
  undefined8 uStack_170;
  code *local_168;
  undefined8 local_160;
  Object local_158 [8];
  code *local_150;
  undefined8 uStack_148;
  code *local_140;
  undefined8 local_138;
  Object local_130 [8];
  code *local_128;
  undefined8 uStack_120;
  code *local_118;
  undefined8 local_110;
  Object local_108 [8];
  code *local_100;
  undefined8 uStack_f8;
  code *local_f0;
  undefined8 local_e8;
  undefined1 local_e0 [16];
  QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
  QStack_d0;
  code *local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [16];
  QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
  QStack_a8;
  code *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
  QStack_80;
  code *local_78;
  undefined8 local_70;
  Object local_68 [8];
  code *local_60;
  undefined8 uStack_58;
  code *local_50;
  undefined8 local_48;
  Object local_40 [28];
  QFlags<Qt::WindowType> local_24;
  QWidget *local_20;
  QWidget *parent_local;
  AbstractScrollAreaPrivate *dd_local;
  AbstractScrollArea *this_local;
  
  local_20 = parent;
  parent_local = (QWidget *)dd;
  dd_local = (AbstractScrollAreaPrivate *)this;
  QFlags<Qt::WindowType>::QFlags(&local_24);
  QFrame::QFrame(&this->super_QFrame,parent,(QFlags_conflict1 *)(ulong)local_24.i);
  *(undefined ***)this = &PTR_metaObject_00234ef8;
  *(undefined ***)&this->field_0x10 = &PTR__AbstractScrollArea_002350c0;
  ctx = parent_local;
  QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
  ::QScopedPointer(&this->d,(AbstractScrollAreaPrivate *)parent_local);
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  AbstractScrollAreaPrivate::init(pAVar1,(EVP_PKEY_CTX *)ctx);
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  local_50 = QTimer::timeout;
  local_48 = 0;
  local_60 = _q_animateScrollIndicators;
  uStack_58 = 0;
  type = (ConnectionType)this;
  QObject::
  connect<void(QTimer::*)(QTimer::QPrivateSignal),void(QtMWidgets::AbstractScrollArea::*)()>
            (local_40,(offset_in_QTimer_to_subr)pAVar1->animationTimer,(Object *)QTimer::timeout,0,
             type);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  local_78 = QTimer::timeout;
  local_70 = 0;
  local_90._8_8_ = _q_startBlurAnim;
  QStack_80.d = (ScrollerPrivate *)0x0;
  QObject::
  connect<void(QTimer::*)(QTimer::QPrivateSignal),void(QtMWidgets::AbstractScrollArea::*)()>
            (local_68,(offset_in_QTimer_to_subr)pAVar1->startBlurAnimTimer,(Object *)QTimer::timeout
             ,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  local_a0 = Scroller::scroll;
  local_98 = 0;
  local_b8._8_8_ = _q_kineticScrolling;
  QStack_a8.d = (ScrollerPrivate *)0x0;
  QObject::
  connect<void(QtMWidgets::Scroller::*)(int,int),void(QtMWidgets::AbstractScrollArea::*)(int,int)>
            ((Object *)local_90,(offset_in_Scroller_to_subr)pAVar1->scroller,
             (Object *)Scroller::scroll,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_90);
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  local_c8 = Scroller::aboutToStart;
  local_c0 = 0;
  local_e0._8_8_ = _q_kineticScrollingAboutToStart;
  QStack_d0.d = (ScrollerPrivate *)0x0;
  QObject::connect<void(QtMWidgets::Scroller::*)(),void(QtMWidgets::AbstractScrollArea::*)()>
            ((Object *)local_b8,(offset_in_Scroller_to_subr)pAVar1->scroller,
             (Object *)Scroller::aboutToStart,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_b8);
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  local_f0 = Scroller::finished;
  local_e8 = 0;
  local_100 = _q_kineticScrollingFinished;
  uStack_f8 = 0;
  QObject::connect<void(QtMWidgets::Scroller::*)(),void(QtMWidgets::AbstractScrollArea::*)()>
            ((Object *)local_e0,(offset_in_Scroller_to_subr)pAVar1->scroller,
             (Object *)Scroller::finished,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_e0);
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  local_118 = QVariantAnimation::valueChanged;
  local_110 = 0;
  local_128 = _q_horBlurAnim;
  uStack_120 = 0;
  QObject::
  connect<void(QVariantAnimation::*)(QVariant_const&),void(QtMWidgets::AbstractScrollArea::*)(QVariant_const&)>
            (local_108,(offset_in_QVariantAnimation_to_subr)pAVar1->horBlurAnim,
             (Object *)QVariantAnimation::valueChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_108);
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  local_140 = QAbstractAnimation::finished;
  local_138 = 0;
  local_150 = _q_horBlurAnimFinished;
  uStack_148 = 0;
  QObject::connect<void(QAbstractAnimation::*)(),void(QtMWidgets::AbstractScrollArea::*)()>
            (local_130,(offset_in_QAbstractAnimation_to_subr)pAVar1->horBlurAnim,
             (Object *)QAbstractAnimation::finished,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_130);
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  local_168 = QVariantAnimation::valueChanged;
  local_160 = 0;
  local_178 = _q_vertBlurAnim;
  uStack_170 = 0;
  QObject::
  connect<void(QVariantAnimation::*)(QVariant_const&),void(QtMWidgets::AbstractScrollArea::*)(QVariant_const&)>
            (local_158,(offset_in_QVariantAnimation_to_subr)pAVar1->vertBlurAnim,
             (Object *)QVariantAnimation::valueChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_158);
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  QObject::connect<void(QAbstractAnimation::*)(),void(QtMWidgets::AbstractScrollArea::*)()>
            (local_180,(offset_in_QAbstractAnimation_to_subr)pAVar1->vertBlurAnim,
             (Object *)QAbstractAnimation::finished,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_180);
  return;
}

Assistant:

AbstractScrollArea::AbstractScrollArea( AbstractScrollAreaPrivate * dd,
	QWidget * parent )
	:	QFrame( parent )
	,	d( dd )
{
	d->init();

	connect( d->animationTimer, &QTimer::timeout,
		this, &AbstractScrollArea::_q_animateScrollIndicators );

	connect( d->startBlurAnimTimer, &QTimer::timeout,
		this, &AbstractScrollArea::_q_startBlurAnim );

	connect( d->scroller, &Scroller::scroll,
		this, &AbstractScrollArea::_q_kineticScrolling );

	connect( d->scroller, &Scroller::aboutToStart,
		this, &AbstractScrollArea::_q_kineticScrollingAboutToStart );

	connect( d->scroller, &Scroller::finished,
		this, &AbstractScrollArea::_q_kineticScrollingFinished );

	connect( d->horBlurAnim, &QVariantAnimation::valueChanged,
		this, &AbstractScrollArea::_q_horBlurAnim );

	connect( d->horBlurAnim, &QVariantAnimation::finished,
		this, &AbstractScrollArea::_q_horBlurAnimFinished );

	connect( d->vertBlurAnim, &QVariantAnimation::valueChanged,
		this, &AbstractScrollArea::_q_vertBlurAnim );

	connect( d->vertBlurAnim, &QVariantAnimation::finished,
		this, &AbstractScrollArea::_q_vertBlurAnimFinished );
}